

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaFixupTypeAttributeUses(xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr type)

{
  xmlSchemaTypePtr type_00;
  long *plVar1;
  void *pvVar2;
  int iVar3;
  xmlSchemaItemListPtr pxVar4;
  xmlSchemaAttributeUsePtr_conflict tmp;
  int usesCount;
  xmlSchemaAttributeUseProhibPtr pro;
  int j;
  int i;
  xmlSchemaItemListPtr prohibs;
  xmlSchemaItemListPtr baseUses;
  xmlSchemaItemListPtr uses;
  xmlSchemaAttributeUsePtr_conflict use;
  xmlSchemaTypePtr baseType;
  xmlSchemaTypePtr type_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  _j = (xmlSchemaItemListPtr)0x0;
  if (type->baseType == (xmlSchemaTypePtr)0x0) {
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaFixupTypeAttributeUses","no base type");
    pctxt_local._4_4_ = -1;
  }
  else {
    type_00 = type->baseType;
    if (((type_00->type == XML_SCHEMA_TYPE_BASIC) || ((type_00->flags & 0x400000U) != 0)) ||
       (iVar3 = xmlSchemaTypeFixup(type_00,(xmlSchemaAbstractCtxtPtr)pctxt), iVar3 != -1)) {
      baseUses = (xmlSchemaItemListPtr)type->attrUses;
      plVar1 = (long *)type_00->attrUses;
      if (baseUses != (xmlSchemaItemListPtr)0x0) {
        if ((type->flags & 4U) == 0) {
          iVar3 = xmlSchemaExpandAttributeGroupRefs
                            (pctxt,(xmlSchemaBasicItemPtr)type,&type->attributeWildcard,baseUses,
                             (xmlSchemaItemListPtr)0x0);
          if (iVar3 == -1) {
            xmlSchemaInternalErr
                      ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaFixupTypeAttributeUses",
                       "failed to expand attributes");
          }
        }
        else {
          iVar3 = xmlSchemaExpandAttributeGroupRefs
                            (pctxt,(xmlSchemaBasicItemPtr)type,&type->attributeWildcard,baseUses,
                             pctxt->attrProhibs);
          if (iVar3 == -1) {
            xmlSchemaInternalErr
                      ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaFixupTypeAttributeUses",
                       "failed to expand attributes");
          }
          if (pctxt->attrProhibs->nbItems != 0) {
            _j = pctxt->attrProhibs;
          }
        }
      }
      if (plVar1 != (long *)0x0) {
        if ((type->flags & 4U) == 0) {
          for (pro._4_4_ = 0; pro._4_4_ < (int)plVar1[1]; pro._4_4_ = pro._4_4_ + 1) {
            pvVar2 = *(void **)(*plVar1 + (long)pro._4_4_ * 8);
            if (baseUses == (xmlSchemaItemListPtr)0x0) {
              pxVar4 = xmlSchemaItemListCreate();
              type->attrUses = pxVar4;
              if (type->attrUses == (void *)0x0) {
                return -1;
              }
              baseUses = (xmlSchemaItemListPtr)type->attrUses;
            }
            xmlSchemaItemListAddSize(baseUses,(int)plVar1[1],pvVar2);
          }
        }
        else {
          if (baseUses == (xmlSchemaItemListPtr)0x0) {
            tmp._4_4_ = 0;
          }
          else {
            tmp._4_4_ = baseUses->nbItems;
          }
          for (pro._4_4_ = 0; pro._4_4_ < (int)plVar1[1]; pro._4_4_ = pro._4_4_ + 1) {
            pvVar2 = *(void **)(*plVar1 + (long)pro._4_4_ * 8);
            if (_j != (xmlSchemaItemListPtr)0x0) {
              for (pro._0_4_ = 0; (int)pro < _j->nbItems; pro._0_4_ = (int)pro + 1) {
                if ((*(long *)(*(long *)((long)pvVar2 + 0x18) + 0x10) ==
                     *(long *)((long)_j->items[(int)pro] + 0x10)) &&
                   (*(long *)(*(long *)((long)pvVar2 + 0x18) + 0x70) ==
                    *(long *)((long)_j->items[(int)pro] + 0x18))) goto LAB_0022168c;
              }
            }
            if (tmp._4_4_ != 0) {
              for (pro._0_4_ = 0; (int)pro < tmp._4_4_; pro._0_4_ = (int)pro + 1) {
                if ((*(long *)(*(long *)((long)pvVar2 + 0x18) + 0x10) ==
                     *(long *)(*(long *)((long)baseUses->items[(int)pro] + 0x18) + 0x10)) &&
                   (*(long *)(*(long *)((long)pvVar2 + 0x18) + 0x70) ==
                    *(long *)(*(long *)((long)baseUses->items[(int)pro] + 0x18) + 0x70)))
                goto LAB_0022168c;
              }
            }
            if (baseUses == (xmlSchemaItemListPtr)0x0) {
              pxVar4 = xmlSchemaItemListCreate();
              type->attrUses = pxVar4;
              if (type->attrUses == (void *)0x0) {
                return -1;
              }
              baseUses = (xmlSchemaItemListPtr)type->attrUses;
            }
            xmlSchemaItemListAddSize(baseUses,2,pvVar2);
LAB_0022168c:
          }
        }
      }
      if ((baseUses != (xmlSchemaItemListPtr)0x0) && (baseUses->nbItems == 0)) {
        xmlSchemaItemListFree(baseUses);
        type->attrUses = (void *)0x0;
      }
      if (((type->flags & 2U) != 0) && (type_00->attributeWildcard != (xmlSchemaWildcardPtr)0x0)) {
        if (type->attributeWildcard == (xmlSchemaWildcardPtr)0x0) {
          type->attributeWildcard = type_00->attributeWildcard;
        }
        else {
          iVar3 = xmlSchemaUnionWildcards(pctxt,type->attributeWildcard,type_00->attributeWildcard);
          if (iVar3 == -1) {
            return -1;
          }
        }
      }
      pctxt_local._4_4_ = 0;
    }
    else {
      pctxt_local._4_4_ = -1;
    }
  }
  return pctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaFixupTypeAttributeUses(xmlSchemaParserCtxtPtr pctxt,
				  xmlSchemaTypePtr type)
{
    xmlSchemaTypePtr baseType = NULL;
    xmlSchemaAttributeUsePtr use;
    xmlSchemaItemListPtr uses, baseUses, prohibs = NULL;

    if (type->baseType == NULL) {
	PERROR_INT("xmlSchemaFixupTypeAttributeUses",
	    "no base type");
        return (-1);
    }
    baseType = type->baseType;
    if (WXS_IS_TYPE_NOT_FIXED(baseType))
	if (xmlSchemaTypeFixup(baseType, ACTXT_CAST pctxt) == -1)
	    return(-1);

    uses = type->attrUses;
    baseUses = baseType->attrUses;
    /*
    * Expand attribute group references. And build the 'complete'
    * wildcard, i.e. intersect multiple wildcards.
    * Move attribute prohibitions into a separate list.
    */
    if (uses != NULL) {
	if (WXS_IS_RESTRICTION(type)) {
	    /*
	    * This one will transfer all attr. prohibitions
	    * into pctxt->attrProhibs.
	    */
	    if (xmlSchemaExpandAttributeGroupRefs(pctxt,
		WXS_BASIC_CAST type, &(type->attributeWildcard), uses,
		pctxt->attrProhibs) == -1)
	    {
		PERROR_INT("xmlSchemaFixupTypeAttributeUses",
		"failed to expand attributes");
	    }
	    if (pctxt->attrProhibs->nbItems != 0)
		prohibs = pctxt->attrProhibs;
	} else {
	    if (xmlSchemaExpandAttributeGroupRefs(pctxt,
		WXS_BASIC_CAST type, &(type->attributeWildcard), uses,
		NULL) == -1)
	    {
		PERROR_INT("xmlSchemaFixupTypeAttributeUses",
		"failed to expand attributes");
	    }
	}
    }
    /*
    * Inherit the attribute uses of the base type.
    */
    if (baseUses != NULL) {
	int i, j;
	xmlSchemaAttributeUseProhibPtr pro;

	if (WXS_IS_RESTRICTION(type)) {
	    int usesCount;
	    xmlSchemaAttributeUsePtr tmp;

	    if (uses != NULL)
		usesCount = uses->nbItems;
	    else
		usesCount = 0;

	    /* Restriction. */
	    for (i = 0; i < baseUses->nbItems; i++) {
		use = baseUses->items[i];
		if (prohibs) {
		    /*
		    * Filter out prohibited uses.
		    */
		    for (j = 0; j < prohibs->nbItems; j++) {
			pro = prohibs->items[j];
			if ((WXS_ATTRUSE_DECL_NAME(use) == pro->name) &&
			    (WXS_ATTRUSE_DECL_TNS(use) ==
				pro->targetNamespace))
			{
			    goto inherit_next;
			}
		    }
		}
		if (usesCount) {
		    /*
		    * Filter out existing uses.
		    */
		    for (j = 0; j < usesCount; j++) {
			tmp = uses->items[j];
			if ((WXS_ATTRUSE_DECL_NAME(use) ==
				WXS_ATTRUSE_DECL_NAME(tmp)) &&
			    (WXS_ATTRUSE_DECL_TNS(use) ==
				WXS_ATTRUSE_DECL_TNS(tmp)))
			{
			    goto inherit_next;
			}
		    }
		}
		if (uses == NULL) {
		    type->attrUses = xmlSchemaItemListCreate();
		    if (type->attrUses == NULL)
			goto exit_failure;
		    uses = type->attrUses;
		}
		xmlSchemaItemListAddSize(uses, 2, use);
inherit_next: {}
	    }
	} else {
	    /* Extension. */
	    for (i = 0; i < baseUses->nbItems; i++) {
		use = baseUses->items[i];
		if (uses == NULL) {
		    type->attrUses = xmlSchemaItemListCreate();
		    if (type->attrUses == NULL)
			goto exit_failure;
		    uses = type->attrUses;
		}
		xmlSchemaItemListAddSize(uses, baseUses->nbItems, use);
	    }
	}
    }
    /*
    * Shrink attr. uses.
    */
    if (uses) {
	if (uses->nbItems == 0) {
	    xmlSchemaItemListFree(uses);
	    type->attrUses = NULL;
	}
	/*
	* TODO: We could shrink the size of the array
	* to fit the actual number of items.
	*/
    }
    /*
    * Compute the complete wildcard.
    */
    if (WXS_IS_EXTENSION(type)) {
	if (baseType->attributeWildcard != NULL) {
	    /*
	    * (3.2.2.1) "If the `base wildcard` is non-`absent`, then
	    * the appropriate case among the following:"
	    */
	    if (type->attributeWildcard != NULL) {
		/*
		* Union the complete wildcard with the base wildcard.
		* SPEC {attribute wildcard}
		* (3.2.2.1.2) "otherwise a wildcard whose {process contents}
		* and {annotation} are those of the `complete wildcard`,
		* and whose {namespace constraint} is the intensional union
		* of the {namespace constraint} of the `complete wildcard`
		* and of the `base wildcard`, as defined in Attribute
		* Wildcard Union ($3.10.6)."
		*/
		if (xmlSchemaUnionWildcards(pctxt, type->attributeWildcard,
		    baseType->attributeWildcard) == -1)
		    goto exit_failure;
	    } else {
		/*
		* (3.2.2.1.1) "If the `complete wildcard` is `absent`,
		* then the `base wildcard`."
		*/
		type->attributeWildcard = baseType->attributeWildcard;
	    }
	} else {
	    /*
	    * (3.2.2.2) "otherwise (the `base wildcard` is `absent`) the
	    * `complete wildcard`"
	    * NOOP
	    */
	}
    } else {
	/*
	* SPEC {attribute wildcard}
	* (3.1) "If the <restriction> alternative is chosen, then the
	* `complete wildcard`;"
	* NOOP
	*/
    }

    return (0);

exit_failure:
    return(-1);
}